

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_simple.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar2
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hello;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world_1
  ;
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  cache;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_28a0;
  bool local_2880;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2878;
  bool local_2858;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2850;
  bool local_2830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27e8;
  unsigned_long local_27c8;
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  local_27c0;
  
  cappuccino::
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::rr_cache(&local_27c0,2,1.0);
  local_28a0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  local_27e8._M_dataplus._M_p = (pointer)&local_27e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_27e8,"Hello","");
  cappuccino::
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_27c0,(unsigned_long *)&local_28a0,&local_27e8,insert_or_update);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27e8._M_dataplus._M_p != &local_27e8.field_2) {
    operator_delete(local_27e8._M_dataplus._M_p,local_27e8.field_2._M_allocated_capacity + 1);
  }
  local_28a0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  local_2808._M_dataplus._M_p = (pointer)&local_2808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2808,"World","");
  cappuccino::
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_27c0,(unsigned_long *)&local_28a0,&local_2808,insert_or_update);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2808._M_dataplus._M_p != &local_2808.field_2) {
    operator_delete(local_2808._M_dataplus._M_p,local_2808.field_2._M_allocated_capacity + 1);
  }
  local_2878._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  cappuccino::
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_28a0,&local_27c0,(unsigned_long *)&local_2878);
  local_2850._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  cappuccino::
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_2878,&local_27c0,(unsigned_long *)&local_2850);
  if (local_2880 == true) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_28a0._M_value._M_dataplus._M_p,
                        local_28a0._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    if (local_2858 != false) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)local_2878._M_value._M_dataplus._M_p,
                          local_2878._M_value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_2858 == true) {
        local_2858 = false;
        if (local_2878._M_value._M_dataplus._M_p !=
            (_Alloc_hider)((long)&local_2878._M_value + 0x10)) {
          operator_delete((void *)local_2878._M_value._M_dataplus._M_p,local_2878._16_8_ + 1);
        }
      }
      if (local_2880 == true) {
        local_2880 = false;
        if (local_28a0._M_value._M_dataplus._M_p !=
            (_Alloc_hider)((long)&local_28a0._M_value + 0x10)) {
          operator_delete((void *)local_28a0._M_value._M_dataplus._M_p,local_28a0._16_8_ + 1);
        }
      }
      local_28a0._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x3;
      local_2828._M_dataplus._M_p = (pointer)&local_2828.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2828,"Hola","");
      cappuccino::
      rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::insert(&local_27c0,(unsigned_long *)&local_28a0,&local_2828,insert_or_update);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2828._M_dataplus._M_p != &local_2828.field_2) {
        operator_delete(local_2828._M_dataplus._M_p,local_2828.field_2._M_allocated_capacity + 1);
      }
      local_2878._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x3;
      cappuccino::
      rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_28a0,&local_27c0,(unsigned_long *)&local_2878);
      local_2850._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
      cappuccino::
      rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2878,&local_27c0,(unsigned_long *)&local_2850);
      local_27c8 = 2;
      cappuccino::
      rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2850,&local_27c0,&local_27c8);
      if (local_2880 != false) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_28a0._M_value._M_dataplus._M_p,
                            local_28a0._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        poVar2 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2878;
        if ((local_2858 == false) &&
           (poVar2 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2850, local_2830 != true)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"impossibru!",0xb);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     (poVar2->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_dataplus._M_p,
                     *(long *)((long)&poVar2->
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              + 8));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
        if (local_2830 == true) {
          local_2830 = false;
          if (local_2850._M_value._M_dataplus._M_p !=
              (_Alloc_hider)((long)&local_2850._M_value + 0x10)) {
            operator_delete((void *)local_2850._M_value._M_dataplus._M_p,local_2850._16_8_ + 1);
          }
        }
        if (local_2858 == true) {
          local_2858 = false;
          if (local_2878._M_value._M_dataplus._M_p !=
              (_Alloc_hider)((long)&local_2878._M_value + 0x10)) {
            operator_delete((void *)local_2878._M_value._M_dataplus._M_p,local_2878._16_8_ + 1);
          }
        }
        if (local_2880 == true) {
          local_2880 = false;
          if (local_28a0._M_value._M_dataplus._M_p !=
              (_Alloc_hider)((long)&local_28a0._M_value + 0x10)) {
            operator_delete((void *)local_28a0._M_value._M_dataplus._M_p,local_28a0._16_8_ + 1);
          }
        }
        std::random_device::_M_fini();
        if (local_27c0.m_open_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_27c0.m_open_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_27c0.m_open_list.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_27c0.m_open_list.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_27c0.m_keyed_elements._M_h);
        std::
        vector<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
        ::~vector(&local_27c0.m_elements);
        return 0;
      }
      std::__throw_bad_optional_access();
    }
  }
  std::__throw_bad_optional_access();
}

Assistant:

int main()
{
    // Create a cache with 2 items.
    cappuccino::rr_cache<uint64_t, std::string> cache{2};

    // Insert hello and world.
    cache.insert(1, "Hello");
    cache.insert(2, "World");

    {
        // Grab them
        auto hello = cache.find(1);
        auto world = cache.find(2);

        // Lets use them!
        std::cout << hello.value() << ", " << world.value() << "!" << std::endl;
    }

    // Insert hola, this will replace "Hello" or "World", we don't know!
    cache.insert(3, "Hola");

    {
        auto hola  = cache.find(3); // This will be in the cache.
        auto hello = cache.find(1); // This might be in the cache?
        auto world = cache.find(2); // This might be in the cache?

        std::cout << hola.value() << ", ";

        if (hello.has_value())
        {
            std::cout << hello.value();
        }
        else if (world.has_value())
        {
            std::cout << world.value();
        }
        else
        {
            std::cout << "impossibru!";
        }
        std::cout << std::endl;
    }

    return 0;
}